

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.hpp
# Opt level: O0

bool __thiscall
OpenMD::ForceFieldOptions::setData(ForceFieldOptions *this,string *keyword,string *value)

{
  ParameterBase *pPVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string *in_RDX;
  RealType dval;
  int ival;
  iterator i;
  bool result;
  string *in_stack_00000120;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff90;
  string local_60 [32];
  double local_40;
  uint local_34;
  _Self local_30;
  _Self local_28;
  byte local_19;
  string *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x257375);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar2 = std::operator!=(&local_28,&local_30);
  if (bVar2) {
    bVar2 = isInteger(in_stack_ffffffffffffff90);
    if (bVar2) {
      local_34 = lexi_cast<int>(in_stack_00000120);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                             *)0x2573d6);
      iVar3 = (*ppVar4->second->_vptr_ParameterBase[4])(ppVar4->second,(ulong)local_34);
      local_19 = (byte)iVar3 & 1;
    }
    else {
      bVar2 = isType<double>(in_stack_00000120);
      if (bVar2) {
        local_40 = lexi_cast<double>(in_stack_00000120);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                               *)0x25741f);
        iVar3 = (*ppVar4->second->_vptr_ParameterBase[6])(local_40);
        local_19 = (byte)iVar3 & 1;
      }
      else {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                               *)0x257441);
        pPVar1 = ppVar4->second;
        std::__cxx11::string::string(local_60,local_18);
        iVar3 = (*pPVar1->_vptr_ParameterBase[3])(pPVar1,local_60);
        local_19 = (byte)iVar3 & 1;
        std::__cxx11::string::~string(local_60);
      }
    }
    if ((local_19 & 1) == 0) {
      uVar6 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Unrecognized data type for keyword: %s = %s\n",uVar6,uVar5);
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"%s is an unrecognized keyword\n",uVar6);
    painCave.isFatal = 0;
    simError();
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool setData(const std::string& keyword, const std::string& value) {
      bool result(false);
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        if (isInteger(value)) {
          int ival = lexi_cast<int>(value);
          result   = i->second->setData(ival);
        } else if (isType<RealType>(value)) {
          RealType dval = lexi_cast<RealType>(value);
          result        = i->second->setData(dval);
        } else {
          result = i->second->setData(value);
        }

        if (!result) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Unrecognized data type for keyword: %s = %s\n",
                   keyword.c_str(), value.c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s is an unrecognized keyword\n", keyword.c_str());
        painCave.isFatal = 0;
        simError();
      }

      return result;
    }